

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

int Str_Delay3(int d0,int d1,int d2,int nLutSize)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  iVar4 = d0 >> 4;
  iVar7 = d1 >> 4;
  iVar5 = iVar7;
  if (iVar7 < iVar4) {
    iVar5 = iVar4;
  }
  iVar8 = d2 >> 4;
  iVar1 = iVar8;
  if (iVar8 < iVar5) {
    iVar1 = iVar5;
  }
  uVar2 = d0 & 0xf;
  if (iVar1 != iVar4) {
    uVar2 = 1;
  }
  uVar3 = d1 & 0xf;
  if (iVar1 != iVar7) {
    uVar3 = 1;
  }
  uVar6 = 1;
  if (iVar5 <= iVar8) {
    uVar6 = d2 & 0xf;
  }
  iVar4 = uVar6 + uVar3 + uVar2;
  iVar5 = 0x13;
  if (iVar4 <= nLutSize) {
    iVar5 = iVar4;
  }
  return iVar5 + iVar1 * 0x10;
}

Assistant:

static inline int Str_Delay3( int d0, int d1, int d2, int nLutSize )
{
    int n, d = Abc_MaxInt( Abc_MaxInt(d0 >> 4, d1 >> 4), d2 >> 4 );
    n  = (d == (d0 >> 4)) ? (d0 & 15) : 1;
    n += (d == (d1 >> 4)) ? (d1 & 15) : 1;
    n += (d == (d2 >> 4)) ? (d2 & 15) : 1;
    return (d << 4) + (n > nLutSize ? 19 : n);
}